

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# price_field_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::price::pixie::PriceFieldTest_TestOStreamLong_Test::TestBody
          (PriceFieldTest_TestOStreamLong_Test *this)

{
  char *message;
  AssertHelper AStack_1d8;
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  PriceField field;
  stringstream ss;
  ostream local_180 [376];
  
  bidfx_public_api::price::PriceField::PriceField(&field,0x85e0b0cba7);
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  bidfx_public_api::price::operator<<(local_180,&field);
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<char[13],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"575000333223\"","ss.str()",(char (*) [13])"575000333223",
             &local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_1c0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/price_field_test.cpp"
               ,0x51,message);
    testing::internal::AssertHelper::operator=(&AStack_1d8,(Message *)&local_1c0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_1d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_1c0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  bidfx_public_api::price::PriceField::~PriceField(&field);
  return;
}

Assistant:

TEST(PriceFieldTest, TestOStreamLong)
{
    int64_t value = 575000333223;
    PriceField field = PriceField(value);
    std::stringstream ss;
    ss << field;
    EXPECT_EQ("575000333223", ss.str());
}